

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_various_isolated_edge_cases(void)

{
  local_uint64_type lVar1;
  bool bVar2;
  enable_if_t<std::is_integral<int>::value,_bool> eVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  unsigned_long uVar8;
  long lVar9;
  uintwide_t<256U,_unsigned_short,_void,_false> *u;
  uintwide_t<256U,_unsigned_short,_void,_false> *u_00;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int in_R8D;
  uint shift_amount;
  uint uVar13;
  ulong uVar14;
  uint shift_amount_1;
  longdouble lVar15;
  result_type_conflict1 rVar16;
  result_type_conflict1 rVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  local_uint64_type a_uint;
  local_uint64_type b_uint;
  local_uint64_type c_uint;
  representation_type local_b8;
  value_type_conflict3 avStack_b0 [12];
  double local_98;
  result_type_conflict1 local_90;
  int local_8c;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ul_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> ul_neg;
  
  uVar10 = 0x3000000000f;
  math::wide_integer::uintwide_t<64u,unsigned_short,void,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&a_uint,0xff00000004000000,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  math::wide_integer::uintwide_t<64u,unsigned_short,void,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&b_uint,0x3000000000f,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  bVar2 = math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>::operator<
                    (&a_uint,&b_uint);
  lVar1 = a_uint;
  if (bVar2) {
    a_uint = b_uint;
    b_uint = lVar1;
    uVar14 = 0xff00000004000000;
  }
  else {
    uVar14 = 0x3000000000f;
    uVar10 = 0xff00000004000000;
  }
  c_uint.values.super_array<unsigned_short,_4UL>.elems =
       (representation_type)math::wide_integer::operator/(&a_uint,&b_uint);
  uVar8 = math::wide_integer::uintwide_t<64u,unsigned_short,void,false>::
          extract_builtin_integral_type<unsigned_long,void>(&c_uint);
  b_uint.values.super_array<unsigned_short,_4UL>.elems[0] = 0xffff;
  iVar12 = 0x10;
  math::wide_integer::detail::fixed_static_array<unsigned_short,_16U>::fixed_static_array
            ((fixed_static_array<unsigned_short,_16U> *)&a_uint,0x10,&b_uint);
  b_uint = a_uint;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>();
  bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint);
  for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
    *(undefined2 *)((long)a_uint.values.super_array<unsigned_short,_4UL>.elems + lVar9) = 0;
  }
  b_uint = a_uint;
  c_uint.values.super_array<unsigned_short,_4UL>.elems =
       (representation_type)
       ((ulong)c_uint.values.super_array<unsigned_short,_4UL>.elems & 0xffffffff00000000);
  eVar3 = math::wide_integer::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,(int *)&c_uint);
  for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
    *(undefined2 *)((long)a_uint.values.super_array<unsigned_short,_4UL>.elems + lVar9) = 0xffff;
  }
  b_uint = a_uint;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>();
  bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint);
  c_uint.values.super_array<unsigned_short,_4UL>.elems[0] = 0xffff;
  math::wide_integer::detail::fixed_static_array<unsigned_short,_16U>::fixed_static_array
            ((fixed_static_array<unsigned_short,_16U> *)&b_uint,0x10,&c_uint);
  a_uint = b_uint;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>();
  bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint);
  bVar2 = (bVar5 && (bVar4 && (bVar2 && eVar3))) &&
          (uVar8 == 0x54ffff && uVar10 / uVar14 == 0x54ffff);
  do {
    while( true ) {
      bVar4 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if (bVar4) {
        iVar12 = 0x100;
        while (bVar4 = iVar12 != 0, iVar12 = iVar12 + -1, bVar4) {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                     (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
          math::wide_integer::operator<<
                    ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                      *)&b_uint,(uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,-4);
          math::wide_integer::operator>>
                    ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                      *)&c_uint,(uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,4);
          math::wide_integer::operator>>
                    (&ul_neg,(uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,-4);
          math::wide_integer::operator<<
                    (&ul_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,4);
          bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                            (&ul_neg,&ul_ctrl);
          bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                             (enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                              *)&c_uint);
          bVar2 = (bool)(bVar2 & (bVar5 && bVar4));
        }
        iVar12 = 0x100;
        while( true ) {
          bVar4 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar4) break;
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                    ((uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,
                     (test_uintwide_t_edge *)0x0,false,0x4c,in_R8D);
          math::wide_integer::operator<<
                    ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                      *)&b_uint,(uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,-4);
          math::wide_integer::operator>>
                    ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                      *)&c_uint,(uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,4);
          math::wide_integer::operator>>
                    ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                      *)&ul_neg,(uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,-4);
          math::wide_integer::operator<<
                    ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                      *)&ul_ctrl,(uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,4);
          bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                            ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                              *)&ul_neg,
                             (enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                              *)&ul_ctrl);
          bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_true> *)&b_uint,
                             (uintwide_t<256U,_unsigned_short,_void,_true> *)&c_uint);
          bVar2 = (bool)(bVar2 & (bVar5 && bVar4));
        }
        math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
        uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::
        value&&std::is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::
        digits>std::numeric_limits<unsigned_short>::digits)),void>::type__
                  ((uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,1,
                   (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
                    *)0x0);
        math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
        uintwide_t<unsigned_short>(unsigned_short,std::enable_if<(std::is_integral<unsigned_short>::
        value&&std::is_unsigned<unsigned_short>::value)&&(std::numeric_limits<unsigned_short>::
        digits<=std::numeric_limits<unsigned_short>::digits),void>::type__
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,0,
                   (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                   (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>
                  ();
        bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                           (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
        uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::
        value&&std::is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::
        digits>std::numeric_limits<unsigned_short>::digits)),void>::type__
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,1,
                   (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
                    *)0x0);
        math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
        uintwide_t<unsigned_short>(unsigned_short,std::enable_if<(std::is_integral<unsigned_short>::
        value&&std::is_unsigned<unsigned_short>::value)&&(std::numeric_limits<unsigned_short>::
        digits<=std::numeric_limits<unsigned_short>::digits),void>::type__
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,0,
                   (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                   (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>
                  ();
        bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                           (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        bVar11 = (bVar5 && bVar4) & bVar2;
        iVar12 = 0x100;
        while (bVar2 = iVar12 != 0, iVar12 = iVar12 + -1, bVar2) {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                     (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
          math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                     &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
          math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
          limits_helper_max<false>();
          bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                             (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
          bVar11 = bVar11 & bVar2;
        }
        iVar12 = 0x100;
        while (bVar2 = iVar12 != 0, iVar12 = iVar12 + -1, bVar2) {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                     (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
          b_uint = a_uint;
          c_uint.values.super_array<unsigned_short,_4UL>.elems =
               (representation_type)(array<unsigned_short,_4UL>)0x0;
          math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator/=
                    ((uintwide_t<256U,_unsigned_short,_void,_true> *)&b_uint,
                     (uintwide_t<256U,_unsigned_short,_void,_true> *)&c_uint);
          math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::limits_helper_max<true>
                    ();
          bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_true> *)&b_uint,
                             (uintwide_t<256U,_unsigned_short,_void,_true> *)&c_uint);
          bVar11 = bVar11 & bVar2;
        }
        a_uint.values.super_array<unsigned_short,_4UL>.elems =
             (representation_type)(array<unsigned_short,_4UL>)0x0;
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                   &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>
                  ();
        bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                           (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        bVar11 = bVar2 & bVar11;
        iVar12 = 0x100;
        while (bVar2 = iVar12 != 0, iVar12 = iVar12 + -1, bVar2) {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                     (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
          math::wide_integer::operator%
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                     &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint);
          bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                             &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
          bVar11 = bVar11 & bVar2;
        }
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                   "10000000000000000000000000000000000000000");
        b_uint = a_uint;
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint,
                   "10000000000000000000000000000000000000000");
        u = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator%=
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint);
        u_00 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator%=
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,
                          (uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint);
        ul_neg.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
             ul_neg.values.super_array<unsigned_short,_16UL>.elems._0_8_ & 0xffffffff00000000;
        eVar3 = math::wide_integer::operator==(u,(int *)&ul_neg);
        iVar12 = 0;
        bVar2 = false;
        if (eVar3) {
          ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
               ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ & 0xffffffff00000000;
          eVar3 = math::wide_integer::operator==(u_00,(int *)&ul_ctrl);
          bVar2 = (bool)(eVar3 & bVar11);
        }
        while (iVar12 != 0x100) {
          local_98 = (double)CONCAT44(local_98._4_4_,iVar12);
          for (uVar13 = 300; uVar13 < 2000; uVar13 = uVar13 + 100) {
            generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,
                       (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
            c_uint = a_uint;
            math::wide_integer::operator<<
                      ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                        *)&b_uint,
                       (enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                        *)&c_uint,uVar13);
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
                 a_uint.values.super_array<unsigned_short,_4UL>.elems;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            math::wide_integer::operator<<
                      ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                        *)&c_uint,&ul_neg,uVar13);
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
                 a_uint.values.super_array<unsigned_short,_4UL>.elems;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            math::wide_integer::operator>>(&ul_neg,&ul_ctrl,uVar13);
            avStack_b0[4] = 0;
            avStack_b0[5] = 0;
            avStack_b0[6] = 0;
            avStack_b0[7] = 0;
            avStack_b0[8] = 0;
            avStack_b0[9] = 0;
            avStack_b0[10] = 0;
            avStack_b0[0xb] = 0;
            local_b8.super_array<unsigned_short,_4UL>.elems =
                 (array<unsigned_short,_4UL>)
                 (array<unsigned_short,_4UL>)a_uint.values.super_array<unsigned_short,_4UL>.elems;
            avStack_b0[0] = 0;
            avStack_b0[1] = 0;
            avStack_b0[2] = 0;
            avStack_b0[3] = 0;
            math::wide_integer::operator>>
                      (&ul_ctrl,(uintwide_t<256U,_unsigned_short,_void,_false> *)&local_b8,uVar13);
            bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                                *)&b_uint,
                               &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
            bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                                *)&c_uint,
                               &zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
            bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                              (&ul_neg,&zero_as_small_unsigned_type::
                                        local_zero_as_small_unsigned_type);
            bVar7 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                              (&ul_ctrl,&zero_as_small_unsigned_type::
                                         local_zero_as_small_unsigned_type);
            bVar2 = (bool)(bVar2 & ((bVar7 && bVar6) && (bVar5 && bVar4)));
          }
          iVar12 = local_98._0_4_ + 1;
        }
        for (iVar12 = 0; iVar12 != 0x100; iVar12 = iVar12 + 1) {
          for (uVar13 = 300; uVar13 < 2000; uVar13 = uVar13 + 100) {
            generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,
                       (test_uintwide_t_edge *)0x0,false,0x4c,in_R8D);
            b_uint.values.super_array<unsigned_short,_4UL>.elems =
                 (representation_type)
                 ((ulong)b_uint.values.super_array<unsigned_short,_4UL>.elems & 0xffffffff00000000);
            eVar3 = math::wide_integer::operator<
                              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&a_uint,
                               (int *)&b_uint);
            c_uint = a_uint;
            math::wide_integer::operator<<
                      ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&b_uint,
                       (enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&c_uint,uVar13);
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
                 a_uint.values.super_array<unsigned_short,_4UL>.elems;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            ul_neg.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            math::wide_integer::operator<<
                      ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&c_uint,
                       (enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&ul_neg,uVar13);
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
                 a_uint.values.super_array<unsigned_short,_4UL>.elems;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            ul_ctrl.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            math::wide_integer::operator>>
                      ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&ul_neg,
                       (enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&ul_ctrl,uVar13);
            avStack_b0[4] = 0;
            avStack_b0[5] = 0;
            avStack_b0[6] = 0;
            avStack_b0[7] = 0;
            avStack_b0[8] = 0;
            avStack_b0[9] = 0;
            avStack_b0[10] = 0;
            avStack_b0[0xb] = 0;
            local_b8.super_array<unsigned_short,_4UL>.elems =
                 (array<unsigned_short,_4UL>)
                 (array<unsigned_short,_4UL>)a_uint.values.super_array<unsigned_short,_4UL>.elems;
            avStack_b0[0] = 0;
            avStack_b0[1] = 0;
            avStack_b0[2] = 0;
            avStack_b0[3] = 0;
            math::wide_integer::operator>>
                      ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                        *)&ul_ctrl,(uintwide_t<256U,_unsigned_short,_void,_true> *)&local_b8,uVar13)
            ;
            avStack_b0[4] = 0;
            avStack_b0[5] = 0;
            avStack_b0[6] = 0;
            avStack_b0[7] = 0;
            avStack_b0[8] = 0;
            avStack_b0[9] = 0;
            avStack_b0[10] = 0;
            avStack_b0[0xb] = 0;
            local_b8.super_array<unsigned_short,_4UL>.elems =
                 (array<unsigned_short,_4UL>)(value_type_conflict3  [4])0x0;
            avStack_b0[0] = 0;
            avStack_b0[1] = 0;
            avStack_b0[2] = 0;
            avStack_b0[3] = 0;
            bVar4 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                                *)&b_uint,(uintwide_t<256U,_unsigned_short,_void,_true> *)&local_b8)
            ;
            avStack_b0[4] = 0;
            avStack_b0[5] = 0;
            avStack_b0[6] = 0;
            avStack_b0[7] = 0;
            avStack_b0[8] = 0;
            avStack_b0[9] = 0;
            avStack_b0[10] = 0;
            avStack_b0[0xb] = 0;
            local_b8.super_array<unsigned_short,_4UL>.elems =
                 (array<unsigned_short,_4UL>)(value_type_conflict3  [4])0x0;
            avStack_b0[0] = 0;
            avStack_b0[1] = 0;
            avStack_b0[2] = 0;
            avStack_b0[3] = 0;
            bVar5 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                                *)&c_uint,(uintwide_t<256U,_unsigned_short,_void,_true> *)&local_b8)
            ;
            if (eVar3) {
              avStack_b0[4] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[8];
              avStack_b0[5] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[9];
              avStack_b0[6] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[10];
              avStack_b0[7] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xb];
              avStack_b0[8] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xc];
              avStack_b0[9] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xd];
              avStack_b0[10] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xe];
              avStack_b0[0xb] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xf];
              uVar18 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._0_4_;
              uVar20 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._4_4_;
              uVar22 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._8_4_;
              uVar24 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._12_4_;
            }
            else {
              uVar18._0_2_ = 0;
              uVar18._2_2_ = 0;
              uVar20._0_2_ = 0;
              uVar20._2_2_ = 0;
              uVar22._0_2_ = 0;
              uVar22._2_2_ = 0;
              uVar24._0_2_ = 0;
              uVar24._2_2_ = 0;
              avStack_b0[4] = 0;
              avStack_b0[5] = 0;
              avStack_b0[6] = 0;
              avStack_b0[7] = 0;
              avStack_b0[8] = 0;
              avStack_b0[9] = 0;
              avStack_b0[10] = 0;
              avStack_b0[0xb] = 0;
            }
            local_b8.super_array<unsigned_short,_4UL>.elems[2] = (value_type_conflict3)uVar20;
            local_b8.super_array<unsigned_short,_4UL>.elems[3] = SUB42(uVar20,2);
            local_b8.super_array<unsigned_short,_4UL>.elems[0] = (value_type_conflict3)uVar18;
            local_b8.super_array<unsigned_short,_4UL>.elems[1] = SUB42(uVar18,2);
            avStack_b0[2] = (value_type_conflict3)uVar24;
            avStack_b0[3] = SUB42(uVar24,2);
            avStack_b0[0] = (value_type_conflict3)uVar22;
            avStack_b0[1] = SUB42(uVar22,2);
            bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&ul_neg,
                               (uintwide_t<256U,_unsigned_short,_void,_true> *)&local_b8);
            if (eVar3) {
              avStack_b0[4] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[8];
              avStack_b0[5] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[9];
              avStack_b0[6] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[10];
              avStack_b0[7] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xb];
              avStack_b0[8] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xc];
              avStack_b0[9] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xd];
              avStack_b0[10] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xe];
              avStack_b0[0xb] =
                   local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems[0xf];
              uVar19 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._0_4_;
              uVar21 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._4_4_;
              uVar23 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._8_4_;
              uVar25 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>
                       .elems._12_4_;
            }
            else {
              uVar19._0_2_ = 0;
              uVar19._2_2_ = 0;
              uVar21._0_2_ = 0;
              uVar21._2_2_ = 0;
              uVar23._0_2_ = 0;
              uVar23._2_2_ = 0;
              uVar25._0_2_ = 0;
              uVar25._2_2_ = 0;
              avStack_b0[4] = 0;
              avStack_b0[5] = 0;
              avStack_b0[6] = 0;
              avStack_b0[7] = 0;
              avStack_b0[8] = 0;
              avStack_b0[9] = 0;
              avStack_b0[10] = 0;
              avStack_b0[0xb] = 0;
            }
            local_b8.super_array<unsigned_short,_4UL>.elems[2] = (value_type_conflict3)uVar21;
            local_b8.super_array<unsigned_short,_4UL>.elems[3] = SUB42(uVar21,2);
            local_b8.super_array<unsigned_short,_4UL>.elems[0] = (value_type_conflict3)uVar19;
            local_b8.super_array<unsigned_short,_4UL>.elems[1] = SUB42(uVar19,2);
            avStack_b0[2] = (value_type_conflict3)uVar25;
            avStack_b0[3] = SUB42(uVar25,2);
            avStack_b0[0] = (value_type_conflict3)uVar23;
            avStack_b0[1] = SUB42(uVar23,2);
            bVar7 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&ul_ctrl,
                               (uintwide_t<256U,_unsigned_short,_void,_true> *)&local_b8);
            bVar2 = (bool)(bVar7 & bVar2 & ((bVar4 && bVar5) && bVar6));
          }
        }
        return bVar2;
      }
      uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
      std::
      discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
      ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
              *)eng_flt,uVar8);
      ul_neg.values.super_array<unsigned_short,_16UL>.elems[0] = 0x47ae;
      ul_neg.values.super_array<unsigned_short,_16UL>.elems[1] = 0x3f81;
      ul_neg.values.super_array<unsigned_short,_16UL>.elems[2] = 0x1eb8;
      ul_neg.values.super_array<unsigned_short,_16UL>.elems[3] = 0x3f85;
      rVar16 = std::uniform_real_distribution<float>::operator()
                         ((uniform_real_distribution<float> *)&ul_neg,
                          (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                           *)eng_flt);
      rVar17 = std::uniform_real_distribution<float>::operator()
                         ((uniform_real_distribution<float> *)&ul_neg,
                          (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                           *)eng_flt);
      local_98 = (double)rVar17 * INFINITY;
      local_90 = std::uniform_real_distribution<float>::operator()
                           ((uniform_real_distribution<float> *)&ul_neg,
                            (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                             *)eng_flt);
      lVar15 = (longdouble)local_90;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<float,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,rVar16 * INFINITY);
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<double,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,local_98);
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
      uintwide_t<long_double,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint,
                 lVar15 * (longdouble)INFINITY);
      ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
           ul_ctrl.values.super_array<unsigned_short,_16UL>.elems._0_8_ & 0xffffffff00000000;
      eVar3 = math::wide_integer::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)&a_uint,(int *)&ul_ctrl);
      if (eVar3) break;
LAB_00113797:
      bVar2 = false;
    }
    local_b8.super_array<unsigned_short,_4UL>.elems =
         (array<unsigned_short,_4UL>)
         ((ulong)local_b8.super_array<unsigned_short,_4UL>.elems & 0xffffffff00000000);
    eVar3 = math::wide_integer::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&b_uint,(int *)&local_b8);
    if (!eVar3) goto LAB_00113797;
    local_8c = 0;
    eVar3 = math::wide_integer::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&c_uint,&local_8c);
    bVar2 = (bool)(eVar3 & bVar2);
  } while( true );
}

Assistant:

auto test_various_isolated_edge_cases() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  auto result_is_ok = true;

  {
    // See also bug report in legacy project long_long_long
    // https://github.com/ckormanyos/long_long_long/issues/11

    using local_uint64_type = local_uintwide_t_tiny_unsigned_type;
    using local_ctrl64_type = std::uint64_t;

    constexpr std::size_t
      max_size
      {
        static_cast<std::size_t>
        (
          std::numeric_limits<local_uint64_type>::digits / 8
        )
      };

    std::array<std::uint8_t, std::size_t { UINT8_C(16) }>
      buffer
      {
        0x00U, 0x00U, 0x00U, 0x04U, 0x00U, 0x00U, 0x00U, 0xFFU, // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        0x0FU, 0x00U, 0x00U, 0x00U, 0x00U, 0x03U, 0x00U, 0x00U  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    local_uint64_type a_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_uint64_type b_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    local_ctrl64_type a_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_ctrl64_type b_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    if(a_uint < b_uint)
    {
      std::swap(a_uint, b_uint);
      std::swap(a_ctrl, b_ctrl);
    }

    const local_uint64_type c_uint = a_uint / b_uint;
    const local_ctrl64_type c_ctrl = a_ctrl / b_ctrl;

    const bool
      result_op_is_ok
      {
           (static_cast<std::uint64_t>(c_uint) == c_ctrl)
        && (UINT64_C(0x000000000054FFFF) == c_ctrl)
      };

    result_is_ok = (result_op_is_ok && result_is_ok);
  }

  {
    using local_rep_type   = typename local_uintwide_t_small_unsigned_type::representation_type;
    using local_value_type = typename local_rep_type::value_type;

    local_rep_type
      rep
      (
        local_uintwide_t_small_unsigned_type::number_of_limbs,
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), static_cast<local_value_type>(UINT8_C(0)));

    const auto rep_as_zero_is_ok = (local_uintwide_t_small_unsigned_type(rep) == 0);

    result_is_ok = (rep_as_zero_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), (std::numeric_limits<local_value_type>::max)());

    const auto rep_as_max2_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max2_is_ok && result_is_ok);

    rep =
      local_rep_type
      (
        static_cast<typename local_rep_type::size_type>(rep.size()), // NOLINT(readability-static-accessed-through-instance)
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max3_is_ok =
    (
      local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (rep_as_max3_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(16));
           ++i)
  {
    eng_flt.seed(util::util_pseudorandom_time_point_seed::value<typename eng_flt_type::result_type>());

    auto dis =
      std::uniform_real_distribution<float>
      {
        static_cast<float>(1.01F), // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        static_cast<float>(1.04F)  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    const auto inf_f  = ::local_inf_f () * dis(eng_flt);
    const auto inf_d  = ::local_inf_d () * static_cast<double>(dis(eng_flt));
    const auto inf_ld = ::local_inf_ld() * static_cast<long double>(dis(eng_flt));

    local_uintwide_t_small_unsigned_type u_inf_f (inf_f);
    local_uintwide_t_small_unsigned_type u_inf_d (inf_d);
    local_uintwide_t_small_unsigned_type u_inf_ld(inf_ld);

    const auto result_infinities_is_ok = (   (u_inf_f  == 0)
                                          && (u_inf_d  == 0)
                                          && (u_inf_ld == 0));

    result_is_ok = (result_infinities_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of an unsigned wide-integer by a signed amount.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto ur_neg  = u_gen << static_cast<int>(INT8_C(-4));
    const auto ur_ctrl = u_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto ul_neg  = u_gen >> static_cast<int>(INT8_C(-4));
    const auto ul_ctrl = u_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (ul_neg == ul_ctrl);
    const auto result_right_is_ok = (ur_neg == ur_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of a signed wide-integer by a signed amount.

    const auto s_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

    const auto sr_neg  = s_gen << static_cast<int>(INT8_C(-4));
    const auto sr_ctrl = s_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto sl_neg  = s_gen >> static_cast<int>(INT8_C(-4));
    const auto sl_ctrl = s_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (sl_neg == sl_ctrl);
    const auto result_right_is_ok = (sr_neg == sr_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= zero_as_limb();

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= local_uintwide_t_small_unsigned_type(zero_as_limb());

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, unsigned numerator by zero which returns the maximum of the type.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    u_gen /= zero_as_small_unsigned_type();

    const auto result_unsigned_div_by_zero_is_ok = (u_gen == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_unsigned_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, signed numerator by zero which returns the maximum of the type.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
    auto n_gen = local_uintwide_t_small_signed_type(u_gen);

    n_gen /= local_uintwide_t_small_signed_type(zero_as_small_unsigned_type());

    const auto result_signed_div_by_zero_is_ok = (n_gen == (std::numeric_limits<local_uintwide_t_small_signed_type>::max)());

    result_is_ok = (result_signed_div_by_zero_is_ok && result_is_ok);
  }

  {
    // Verify division of zero by zero which returns the maximum of the type.

    auto z = zero_as_small_unsigned_type();

    z /= zero_as_small_unsigned_type();

    const auto result_zero_div_by_zero_is_ok = (z == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_zero_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify modulus of zero with a finite denominator which returns zero modulus.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto mod = zero_as_small_unsigned_type() % u_gen;

    const auto result_zero_mod_with_finite_is_ok = (mod == zero_as_small_unsigned_type());

    result_is_ok = (result_zero_mod_with_finite_is_ok && result_is_ok);
  }

  {
    const auto ten_pow_forty = local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000");

          auto a(ten_pow_forty);
    const auto b(local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000"));

    const auto& c(a %= b);

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    const auto& d(a %= a); // NOLINT(clang-diagnostic-self-assign-overloaded)

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    const auto result_self_mod_is_ok = ((c == 0) && (d == 0));

    result_is_ok = (result_self_mod_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount = // NOLINT(altera-id-dependent-backward-branch)
      static_cast<unsigned>
      (
          static_cast<int>
          (
                (std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(INT8_C(100)))
            + (((std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(INT8_C(100))) != 0) ? 1 : 0)
          )
        *
          static_cast<int>(INT8_C(100))
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      auto result_overshift_is_ok = true;

      const auto u_left_n  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::int32_t> (shift_amount);
      const auto u_left_u  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto u_right_n = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto u_right_u = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::uint32_t>(shift_amount);

      result_overshift_is_ok = ((u_left_n  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_left_u  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_n == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_u == zero_as_small_unsigned_type()) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount =
      static_cast<unsigned>
      (
          (
                (std::numeric_limits<local_uintwide_t_small_signed_type>::digits / 100)                // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
            + (((std::numeric_limits<local_uintwide_t_small_signed_type>::digits % 100) != 0) ? 1 : 0) // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
          )
        *
          100 // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto n_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

      const auto n_is_neg = (n_gen < 0);

      const auto n_left_n  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::int32_t> (shift_amount);
      const auto n_left_u  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto n_right_n = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto n_right_u = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::uint32_t>(shift_amount);

      auto result_overshift_is_ok = true;

      result_overshift_is_ok = ((n_left_n  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_left_u  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_n == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_u == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}